

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
booster::locale::basic_format<wchar_t>::write
          (basic_format<wchar_t> *this,int __fd,void *__buf,size_t __n)

{
  int id;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  stream_type *out;
  string_type local_68;
  undefined1 local_48 [8];
  string_type format;
  
  out = (stream_type *)CONCAT44(in_register_00000034,__fd);
  local_48 = (undefined1  [8])&format._M_string_length;
  format._M_dataplus._M_p = (pointer)0x0;
  format._M_string_length._0_4_ = 0;
  if (this->translate_ == true) {
    std::locale::locale((locale *)((long)&format.field_2 + 8),
                        (locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
    booster::locale::ios_info::get((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
    id = booster::locale::ios_info::domain_id();
    basic_message<wchar_t>::str_abi_cxx11_
              (&local_68,&this->message_,(locale *)((long)&format.field_2 + 8),id);
    std::__cxx11::wstring::operator=((wstring *)local_48,(wstring *)&local_68);
    std::__cxx11::wstring::~wstring((wstring *)&local_68);
    std::locale::~locale((locale *)((long)&format.field_2 + 8));
  }
  else {
    std::__cxx11::wstring::_M_assign((wstring *)local_48);
  }
  format_output(this,out,(string_type *)local_48);
  sVar1 = std::__cxx11::wstring::~wstring((wstring *)local_48);
  return sVar1;
}

Assistant:

void write(stream_type &out) const
            {
                string_type format;
                if(translate_)
                    format = message_.str(out.getloc(),ios_info::get(out).domain_id());
                else
                    format = format_;
               
                format_output(out,format);

            }